

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

array<char,_22UL> * convertToPrintString(double val,char *trailingStr)

{
  double *pdVar1;
  pointer pvVar2;
  size_type sVar3;
  undefined8 in_RSI;
  int __x;
  array<char,_22UL> *in_RDI;
  array<char,_22UL> *paVar4;
  undefined8 in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double l;
  double local_40;
  double local_28;
  double local_20;
  double local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  paVar4 = in_RDI;
  local_10 = in_RSI;
  local_8 = in_XMM0_Qa;
  memset(in_RDI,0,0x16);
  __x = (int)paVar4;
  std::abs(__x);
  if ((extraout_XMM0_Qa != INFINITY) || (NAN(extraout_XMM0_Qa))) {
    local_20 = 1e-06;
    std::abs(__x);
    pdVar1 = std::max<double>(&local_20,&local_28);
    local_40 = log10(*pdVar1);
  }
  else {
    local_40 = 0.0;
  }
  local_18 = local_40;
  switch((int)local_40) {
  case 0:
  case 1:
  case 2:
  case 3:
    pvVar2 = std::array<char,_22UL>::data((array<char,_22UL> *)0x62a76c);
    sVar3 = std::array<char,_22UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.10g%s",local_8,local_10);
    break;
  case 4:
    pvVar2 = std::array<char,_22UL>::data((array<char,_22UL> *)0x62a7ab);
    sVar3 = std::array<char,_22UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.11g%s",local_8,local_10);
    break;
  case 5:
    pvVar2 = std::array<char,_22UL>::data((array<char,_22UL> *)0x62a7ea);
    sVar3 = std::array<char,_22UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.12g%s",local_8,local_10);
    break;
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
    pvVar2 = std::array<char,_22UL>::data((array<char,_22UL> *)0x62a826);
    sVar3 = std::array<char,_22UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.13g%s",local_8,local_10);
    break;
  default:
    pvVar2 = std::array<char,_22UL>::data((array<char,_22UL> *)0x62a862);
    sVar3 = std::array<char,_22UL>::size(in_RDI);
    snprintf(pvVar2,sVar3,"%.9g%s",local_8,local_10);
  }
  return in_RDI;
}

Assistant:

static std::array<char, 22> convertToPrintString(double val,
                                                 const char* trailingStr = "") {
  decltype(convertToPrintString(std::declval<double>(),
                                std::declval<char*>())) printString = {};
  double l = std::abs(val) == kHighsInf
                 ? 0.0
                 : std::log10(std::max(1e-6, std::abs(val)));
  switch (int(l)) {
    case 0:
    case 1:
    case 2:
    case 3:
      std::snprintf(printString.data(), printString.size(), "%.10g%s", val,
                    trailingStr);
      break;
    case 4:
      std::snprintf(printString.data(), printString.size(), "%.11g%s", val,
                    trailingStr);
      break;
    case 5:
      std::snprintf(printString.data(), printString.size(), "%.12g%s", val,
                    trailingStr);
      break;
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
      std::snprintf(printString.data(), printString.size(), "%.13g%s", val,
                    trailingStr);
      break;
    default:
      std::snprintf(printString.data(), printString.size(), "%.9g%s", val,
                    trailingStr);
  }

  return printString;
}